

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

void __thiscall CVmObjGramProd::delete_alt(CVmObjGramProd *this,size_t idx)

{
  byte *pbVar1;
  char *pcVar2;
  
  while( true ) {
    idx = idx + 1;
    pcVar2 = (this->super_CVmObject).ext_;
    if (*(ulong *)(pcVar2 + 0x38) <= idx) break;
    *(undefined8 *)(*(long *)(pcVar2 + 0x30) + -8 + idx * 8) =
         *(undefined8 *)(*(long *)(pcVar2 + 0x30) + idx * 8);
  }
  *(ulong *)(pcVar2 + 0x38) = *(ulong *)(pcVar2 + 0x38) - 1;
  pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
  *pbVar1 = *pbVar1 | 1;
  return;
}

Assistant:

void CVmObjGramProd::delete_alt(size_t idx)
{
    /* remove it from the array and close the gap */
    for ( ; idx + 1 < get_ext()->alt_cnt_ ; ++idx)
        get_ext()->alts_[idx] = get_ext()->alts_[idx+1];

    /* adjust the count */
    get_ext()->alt_cnt_ -= 1;

    /* we've been modified since load time */
    get_ext()->modified_ = TRUE;
}